

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

void __thiscall
FunctionPackage::FunctionPackage
          (FunctionPackage *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>_>_>
          *map)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(map->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    Registry<std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>
    ::add((string *)(p_Var1 + 1),
          (tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
           *)(p_Var1 + 2));
  }
  return;
}

Assistant:

FunctionPackage::FunctionPackage(const std::map<std::string, BuiltinFunction> &map)
{
    for(auto &&p : map)
    {
        FunctionRegistry::add(p.first, p.second);
    }
}